

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_dr_flac__read_utf8_coded_number
                    (ma_dr_flac_bs *bs,ma_uint64 *pNumberOut,ma_uint8 *pCRCOut)

{
  ma_bool32 mVar1;
  uint uVar2;
  ma_result mVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  byte *pResult;
  ulong uVar7;
  ma_uint8 utf8 [7];
  byte local_48;
  byte local_47 [7];
  ma_uint64 *local_40;
  byte *local_38;
  
  pResult = &local_48;
  local_48 = 0;
  local_47[0] = 0;
  local_47[1] = 0;
  local_47[2] = 0;
  local_47[3] = 0;
  local_47[4] = 0;
  local_47[5] = 0;
  bVar6 = *pCRCOut;
  mVar1 = ma_dr_flac__read_uint8(bs,8,&local_48);
  if (mVar1 == 0) {
    *pNumberOut = 0;
LAB_00190ab5:
    mVar3 = MA_AT_END;
  }
  else {
    bVar6 = ""[bVar6 ^ local_48];
    uVar2 = (uint)local_48;
    if ((char)local_48 < '\0') {
      uVar4 = 2;
      if (((((uVar2 & 0xffffffe0) != 0xc0) && (uVar4 = 3, (uVar2 & 0xfffffff0) != 0xe0)) &&
          (uVar4 = 4, (uVar2 & 0xfffffff8) != 0xf0)) &&
         (((uVar4 = 5, (uVar2 & 0xfffffffc) != 0xf8 && (uVar4 = 6, (uVar2 & 0xfffffffe) != 0xfc)) &&
          (uVar4 = 7, uVar2 != 0xfe)))) {
        *pNumberOut = 0;
        return MA_CRC_MISMATCH;
      }
      uVar7 = (ulong)(0x7fU >> (sbyte)uVar4 & uVar2);
      lVar5 = (ulong)uVar4 - 1;
      local_40 = pNumberOut;
      local_38 = pCRCOut;
      do {
        pResult = pResult + 1;
        mVar1 = ma_dr_flac__read_uint8(bs,8,pResult);
        if (mVar1 == 0) {
          *local_40 = 0;
          goto LAB_00190ab5;
        }
        bVar6 = ""[bVar6 ^ *pResult];
        uVar7 = (ulong)(*pResult & 0x3f) | uVar7 << 6;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      *local_40 = uVar7;
      *local_38 = bVar6;
    }
    else {
      *pNumberOut = (ulong)uVar2;
      *pCRCOut = bVar6;
    }
    mVar3 = MA_SUCCESS;
  }
  return mVar3;
}

Assistant:

static ma_result ma_dr_flac__read_utf8_coded_number(ma_dr_flac_bs* bs, ma_uint64* pNumberOut, ma_uint8* pCRCOut)
{
    ma_uint8 crc;
    ma_uint64 result;
    ma_uint8 utf8[7] = {0};
    int byteCount;
    int i;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pNumberOut != NULL);
    MA_DR_FLAC_ASSERT(pCRCOut != NULL);
    crc = *pCRCOut;
    if (!ma_dr_flac__read_uint8(bs, 8, utf8)) {
        *pNumberOut = 0;
        return MA_AT_END;
    }
    crc = ma_dr_flac_crc8(crc, utf8[0], 8);
    if ((utf8[0] & 0x80) == 0) {
        *pNumberOut = utf8[0];
        *pCRCOut = crc;
        return MA_SUCCESS;
    }
    if ((utf8[0] & 0xE0) == 0xC0) {
        byteCount = 2;
    } else if ((utf8[0] & 0xF0) == 0xE0) {
        byteCount = 3;
    } else if ((utf8[0] & 0xF8) == 0xF0) {
        byteCount = 4;
    } else if ((utf8[0] & 0xFC) == 0xF8) {
        byteCount = 5;
    } else if ((utf8[0] & 0xFE) == 0xFC) {
        byteCount = 6;
    } else if ((utf8[0] & 0xFF) == 0xFE) {
        byteCount = 7;
    } else {
        *pNumberOut = 0;
        return MA_CRC_MISMATCH;
    }
    MA_DR_FLAC_ASSERT(byteCount > 1);
    result = (ma_uint64)(utf8[0] & (0xFF >> (byteCount + 1)));
    for (i = 1; i < byteCount; ++i) {
        if (!ma_dr_flac__read_uint8(bs, 8, utf8 + i)) {
            *pNumberOut = 0;
            return MA_AT_END;
        }
        crc = ma_dr_flac_crc8(crc, utf8[i], 8);
        result = (result << 6) | (utf8[i] & 0x3F);
    }
    *pNumberOut = result;
    *pCRCOut = crc;
    return MA_SUCCESS;
}